

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * __thiscall ghc::filesystem::path::relative_path(path *__return_storage_ptr__,path *this)

{
  format fmt;
  string_type local_58;
  string root;
  
  root_path((path *)&local_58,this);
  root._M_dataplus._M_p = (pointer)&root.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == &local_58.field_2) {
    root.field_2._8_8_ = local_58.field_2._8_8_;
  }
  else {
    root._M_dataplus._M_p = local_58._M_dataplus._M_p;
  }
  root._M_string_length = local_58._M_string_length;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::substr((ulong)&local_58,(ulong)this);
  path(__return_storage_ptr__,&local_58,fmt);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&root);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::relative_path() const
{
    std::string root = root_path()._path;
    return path(_path.substr((std::min)(root.length(), _path.length())), generic_format);
}